

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateObjectTypedef
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  Descriptor *in_RCX;
  int i;
  string type_name;
  char *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string local_90 [16];
  Descriptor *in_stack_ffffffffffffff80;
  GeneratorOptions *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  int index;
  undefined4 in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  char (*in_stack_ffffffffffffffa0) [12];
  char *in_stack_ffffffffffffffa8;
  Printer *in_stack_ffffffffffffffb0;
  string local_40 [32];
  Descriptor *local_20;
  
  local_20 = in_RCX;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  Descriptor::name_abi_cxx11_(local_20);
  io::Printer::Print<char[12],std::__cxx11::string,char[9],std::__cxx11::string>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,
             (char (*) [9])CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             &in_stack_ffffffffffffff88->output_dir);
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = Descriptor::field_count(local_20);
    if (iVar1 <= iVar2) break;
    if (0 < index) {
      io::Printer::Print<>
                ((Printer *)CONCAT44(in_stack_ffffffffffffff94,index),
                 (char *)in_stack_ffffffffffffff88);
    }
    Descriptor::field(local_20,index);
    (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
              (in_stack_ffffffffffffff88,(FieldDescriptor *)in_stack_ffffffffffffff80);
    io::Printer::Print<char[10],std::__cxx11::string,char[10],char[2]>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (char (*) [10])in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (char (*) [10])CONCAT44(in_stack_ffffffffffffff94,index),
               (char (*) [2])in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_90);
    iVar2 = index + 1;
  }
  io::Printer::Print<>
            ((Printer *)CONCAT44(in_stack_ffffffffffffff94,index),(char *)in_stack_ffffffffffffff88)
  ;
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Generator::GenerateObjectTypedef(const GeneratorOptions& options,
                                      io::Printer* printer,
                                      const Descriptor* desc) const {
  // TODO(b/122687752): Consider renaming nested messages called ObjectFormat
  //     to prevent collisions.
  const std::string type_name = GetMessagePath(options, desc) + ".ObjectFormat";

  printer->Print(
      "/**\n"
      " * The raw object form of $messageName$ as accepted by the `fromObject` "
      "method.\n"
      " * @record\n"
      " */\n"
      "$typeName$ = function() {\n",
      "messageName", desc->name(), "typeName", type_name);

  for (int i = 0; i < desc->field_count(); i++) {
    if (i > 0) {
      printer->Print("\n");
    }
    printer->Print(
        "  /** @type {$fieldType$|undefined} */\n"
        "  this.$fieldName$;\n",
        "fieldName", JSObjectFieldName(options, desc->field(i)),
        // TODO(b/121097361): Add type checking for field values.
        "fieldType", "?");
  }

  printer->Print("};\n\n");
}